

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

wally_psbt * cfd::core::ParsePsbtData(ByteData *data)

{
  uint uVar1;
  size_t sVar2;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  uint32_t uVar6;
  uchar *puVar7;
  size_type sVar8;
  CfdException *pCVar9;
  reference pvVar10;
  ulong uVar11;
  wally_map *map_in;
  uchar *value;
  size_type value_len;
  Amount AVar12;
  CfdError *except;
  exception *except_1;
  allocator local_6f1;
  string local_6f0;
  CfdSourceLocation local_6d0;
  uint local_6b4;
  ulong uStack_6b0;
  uint32_t offset;
  size_t i;
  string local_6a0;
  CfdSourceLocation local_680;
  undefined1 local_662;
  allocator local_661;
  string local_660;
  CfdSourceLocation local_640;
  undefined1 local_622;
  allocator local_621;
  string local_620;
  CfdSourceLocation local_600;
  undefined1 local_5e2;
  allocator local_5e1;
  string local_5e0;
  CfdSourceLocation local_5c0;
  undefined1 local_5a2;
  allocator local_5a1;
  string local_5a0;
  CfdSourceLocation local_580;
  undefined1 local_562;
  allocator local_561;
  string local_560;
  CfdSourceLocation local_540;
  undefined1 local_522;
  allocator local_521;
  string local_520;
  CfdSourceLocation local_500;
  undefined1 local_4e2;
  allocator local_4e1;
  string local_4e0;
  CfdSourceLocation local_4c0;
  undefined1 local_4a2;
  allocator local_4a1;
  string local_4a0;
  CfdSourceLocation local_480;
  int64_t local_468;
  undefined1 local_460;
  Amount local_458;
  undefined1 auStack_448 [8];
  wally_tx_output output;
  ByteData local_3a0;
  undefined1 local_388 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  value_type *txout;
  uint32_t index;
  CfdSourceLocation local_340;
  undefined1 auStack_328 [8];
  wally_tx tx;
  undefined1 local_2e8 [8];
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> txouts;
  string local_2c8;
  CfdSourceLocation local_2a8;
  ByteData local_290;
  undefined1 local_278 [8];
  Transaction transaction;
  string local_230;
  CfdSourceLocation local_210;
  undefined1 local_1f2;
  allocator local_1f1;
  string local_1f0;
  CfdSourceLocation local_1d0;
  byte local_1b1;
  undefined1 local_1b0 [7];
  bool has_key_1byte;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_180 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  string local_160;
  CfdSourceLocation local_140;
  undefined1 local_122;
  allocator local_121;
  string local_120;
  CfdSourceLocation local_100;
  undefined4 local_e5;
  uchar local_e1;
  undefined1 local_e0 [3];
  uint8_t magic [5];
  Deserializer parser;
  string local_b0;
  CfdSourceLocation local_90;
  size_t local_78;
  size_t tmp_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp_buf;
  int local_3c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  wally_psbt *psbt;
  ByteData *data_local;
  
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,data);
  puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_38);
  sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_38);
  local_3c = wally_psbt_from_bytes
                       (puVar7,sVar8,
                        (wally_psbt **)
                        &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_3c == 0) {
    if ((*(long *)(bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 0x18) != 0) ||
       (*(long *)(bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 0x30) != 0)) {
      data_local = (ByteData *)
                   bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      local_3c = 0;
      goto LAB_0058e2f2;
    }
    sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_38);
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&tmp_size + 7));
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (local_68,sVar8,(allocator<unsigned_char> *)((long)&tmp_size + 7));
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&tmp_size + 7));
    puVar3 = bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    local_78 = 0;
    puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_68);
    sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_68);
    local_3c = wally_psbt_to_bytes((wally_psbt *)puVar3,0,puVar7,sVar8,&local_78);
    sVar2 = local_78;
    if ((local_3c == 0) &&
       (sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_38),
       sVar2 == sVar8)) {
      data_local = (ByteData *)
                   bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    else {
      wally_psbt_free((wally_psbt *)
                      bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_68);
    if ((int)tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage != 0) goto LAB_0058e2f2;
  }
  else {
    if (local_3c != -2) {
      local_90.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_90.filename = local_90.filename + 1;
      local_90.line = 0x650;
      local_90.funcname = "ParsePsbtData";
      logger::warn<int&>(&local_90,"wally_psbt_from_bytes NG[{}]",&local_3c);
      parser._38_1_ = 1;
      pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_b0,"psbt from bytes error.",(allocator *)&parser.field_0x27);
      CfdException::CfdException(pCVar9,kCfdInternalError,&local_b0);
      parser._38_1_ = 0;
      __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_3c = -2;
  }
  Deserializer::Deserializer((Deserializer *)local_e0,data);
  memset(&local_e5,0,5);
  sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_38);
  if (5 < sVar8) {
    Deserializer::ReadArray((Deserializer *)local_e0,(uint8_t *)&local_e5,5);
  }
  iVar5 = memcmp(&local_e5,ParsePsbtData::kPsbtMagic,5);
  if (iVar5 != 0) {
    local_100.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_100.filename = local_100.filename + 1;
    local_100.line = 0x659;
    local_100.funcname = "ParsePsbtData";
    logger::warn<>(&local_100,"psbt unmatch magic.");
    local_122 = 1;
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_120,"psbt unmatch magic error.",&local_121);
    CfdException::CfdException(pCVar9,kCfdInternalError,&local_120);
    local_122 = 0;
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_3c = wally_psbt_init_alloc
                       (0,0,0,0,(wally_psbt **)
                                &bytes.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_3c != 0) {
    local_140.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_140.filename = local_140.filename + 1;
    local_140.line = 0x65e;
    local_140.funcname = "ParsePsbtData";
    logger::warn<int&>(&local_140,"wally_psbt_init_alloc NG[{}]",&local_3c);
    key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_160,"psbt alloc error.",
               (allocator *)
               ((long)&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar9,kCfdInternalError,&local_160);
    key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  *(undefined4 *)
   bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_end_of_storage = local_e5;
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[4] = local_e1;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_180);
  do {
    Deserializer::ReadVariableBuffer
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Deserializer *)local_e0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (local_180,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    bVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(local_180);
    if (!bVar4) {
      Deserializer::ReadVariableBuffer
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b0,
                 (Deserializer *)local_e0);
      sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_180);
      local_1b1 = sVar8 == 1;
      pvVar10 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          (local_180,0);
      if (*pvVar10 == '\0') {
        if ((local_1b1 & 1) == 0) {
          local_1d0.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                       ,0x2f);
          local_1d0.filename = local_1d0.filename + 1;
          local_1d0.line = 0x66d;
          local_1d0.funcname = "ParsePsbtData";
          logger::warn<>(&local_1d0,"psbt invalid key format.");
          local_1f2 = 1;
          pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_1f0,"psbt invalid key format error.",&local_1f1);
          CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,&local_1f0);
          local_1f2 = 0;
          __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (*(long *)(bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 8) != 0) {
          local_210.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                       ,0x2f);
          local_210.filename = local_210.filename + 1;
          local_210.line = 0x672;
          local_210.funcname = "ParsePsbtData";
          logger::warn<>(&local_210,"global tx duplicates.");
          transaction.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_230,"psbt global tx duplicates error.",
                     (allocator *)
                     ((long)&transaction.vout_.
                             super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,&local_230);
          transaction.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
          __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
        }
        ByteData::ByteData(&local_290,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b0);
        Transaction::Transaction((Transaction *)local_278,&local_290);
        ByteData::~ByteData(&local_290);
        uVar6 = Transaction::GetTxInCount((Transaction *)local_278);
        if (uVar6 != 0) {
          local_2a8.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                       ,0x2f);
          local_2a8.filename = local_2a8.filename + 1;
          local_2a8.line = 0x67a;
          local_2a8.funcname = "ParsePsbtData";
          logger::warn<>(&local_2a8,"psbt format error.");
          txouts.
          super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_2c8,"psbt format error.",
                     (allocator *)
                     ((long)&txouts.
                             super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,&local_2c8);
          txouts.
          super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
          __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
        }
        Transaction::GetTxOutList
                  ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
                   local_2e8,(Transaction *)local_278);
        tx.inputs_allocation_len = 0;
        tx.outputs = (wally_tx_output *)0x0;
        tx.inputs = (wally_tx_input *)0x0;
        tx.num_inputs = 0;
        auStack_328._0_4_ = 0;
        auStack_328._4_4_ = 0;
        tx.version = 0;
        tx.locktime = 0;
        tx.num_outputs = 0;
        uVar6 = AbstractTransaction::GetVersion((AbstractTransaction *)local_278);
        auStack_328._0_4_ = uVar6;
        uVar6 = AbstractTransaction::GetLockTime((AbstractTransaction *)local_278);
        auStack_328._4_4_ = uVar6;
        local_3c = wally_psbt_set_global_tx
                             ((wally_psbt *)
                              bytes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (wally_tx *)auStack_328);
        if (local_3c != 0) {
          local_340.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                       ,0x2f);
          local_340.filename = local_340.filename + 1;
          local_340.line = 0x684;
          local_340.funcname = "ParsePsbtData";
          logger::warn<int&>(&local_340,"wally_psbt_set_global_tx NG[{}]",&local_3c);
          txout._6_1_ = 1;
          pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&index,"psbt set tx error.",(allocator *)((long)&txout + 7));
          CfdException::CfdException(pCVar9,kCfdInternalError,(string *)&index);
          txout._6_1_ = 0;
          __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
        }
        local_3c = 0;
        for (txout._0_4_ = 0; uVar11 = (ulong)(uint)txout,
            sVar8 = ::std::
                    vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::
                    size((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                          *)local_2e8), uVar11 < sVar8; txout._0_4_ = (uint)txout + 1) {
          script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)::std::
                        vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                        ::operator[]((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                                      *)local_2e8,(ulong)(uint)txout);
          AbstractTxOutReference::GetLockingScript
                    ((Script *)&output.rangeproof_len,
                     (AbstractTxOutReference *)
                     script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
          Script::GetData(&local_3a0,(Script *)&output.rangeproof_len);
          ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_388,
                             &local_3a0);
          ByteData::~ByteData(&local_3a0);
          Script::~Script((Script *)&output.rangeproof_len);
          output.surjectionproof_len = 0;
          output.rangeproof = (uchar *)0x0;
          output.nonce_len = 0;
          output.surjectionproof = (uchar *)0x0;
          output.value_len = 0;
          output.nonce = (uchar *)0x0;
          output.asset_len = 0;
          output.value = (uchar *)0x0;
          output.features = '\0';
          output._25_7_ = 0;
          output.asset = (uchar *)0x0;
          output.script = (uchar *)0x0;
          output.script_len = 0;
          auStack_448 = (undefined1  [8])0x0;
          output.satoshi = 0;
          AVar12 = AbstractTxOutReference::GetValue
                             ((AbstractTxOutReference *)
                              script_val.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          local_468 = AVar12.amount_;
          local_460 = AVar12.ignore_check_;
          local_458.amount_ = local_468;
          local_458.ignore_check_ = (bool)local_460;
          auStack_448 = (undefined1  [8])Amount::GetSatoshiValue(&local_458);
          output.satoshi =
               (uint64_t)
               ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_388);
          output.script =
               (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_388);
          local_3c = wally_psbt_add_output_at
                               ((wally_psbt *)
                                bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(uint)txout,0,
                                (wally_tx_output *)auStack_448);
          if (local_3c != 0) {
            local_480.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                         ,0x2f);
            local_480.filename = local_480.filename + 1;
            local_480.line = 0x692;
            local_480.funcname = "ParsePsbtData";
            logger::warn<int&>(&local_480,"wally_psbt_add_output_at NG[{}]",&local_3c);
            local_4a2 = 1;
            pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_4a0,"psbt set txout error.",&local_4a1);
            CfdException::CfdException(pCVar9,kCfdInternalError,&local_4a0);
            local_4a2 = 0;
            __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
          }
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_388);
        }
        ::std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::
        ~vector((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
                local_2e8);
        Transaction::~Transaction((Transaction *)local_278);
      }
      else {
        pvVar10 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (local_180,0);
        if (*pvVar10 == 0xfb) {
          if ((local_1b1 & 1) == 0) {
            local_4c0.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                         ,0x2f);
            local_4c0.filename = local_4c0.filename + 1;
            local_4c0.line = 0x698;
            local_4c0.funcname = "ParsePsbtData";
            logger::warn<>(&local_4c0,"psbt invalid key format.");
            local_4e2 = 1;
            pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_4e0,"psbt invalid key format error.",&local_4e1);
            CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,&local_4e0);
            local_4e2 = 0;
            __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
          }
          if (*(int *)(bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x58) != 0) {
            local_500.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                         ,0x2f);
            local_500.filename = local_500.filename + 1;
            local_500.line = 0x69d;
            local_500.funcname = "ParsePsbtData";
            logger::warn<>(&local_500,"psbt version duplicates.");
            local_522 = 1;
            pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_520,"psbt version duplicates error.",&local_521);
            CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,&local_520);
            local_522 = 0;
            __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
          }
          sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b0);
          puVar3 = bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          if (sVar8 != 4) {
            local_540.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                         ,0x2f);
            local_540.filename = local_540.filename + 1;
            local_540.line = 0x6a2;
            local_540.funcname = "ParsePsbtData";
            logger::warn<>(&local_540,"psbt invlid version size.");
            local_562 = 1;
            pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_560,"psbt invlid version size error.",&local_561);
            CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,&local_560);
            local_562 = 0;
            __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
          }
          puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b0);
          *(undefined4 *)(puVar3 + 0x58) = *(undefined4 *)puVar7;
          uVar1 = *(uint *)(bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 0x58);
          uVar6 = Psbt::GetDefaultVersion();
          if (uVar6 < uVar1) {
            local_580.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                         ,0x2f);
            local_580.filename = local_580.filename + 1;
            local_580.line = 0x6a9;
            local_580.funcname = "ParsePsbtData";
            logger::warn<unsigned_int&>
                      (&local_580,"psbt unsupported version[{}]",
                       (uint *)(bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 0x58));
            local_5a2 = 1;
            pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_5a0,"psbt unsupported version error.",&local_5a1);
            CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,&local_5a0);
            local_5a2 = 0;
            __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
          }
        }
        else {
          map_in = (wally_map *)
                   (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 0x40);
          puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_180);
          sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_180);
          value = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b0);
          value_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b0)
          ;
          local_3c = wally_map_add(map_in,puVar7,sVar8,value,value_len);
          if (local_3c != 0) {
            local_5c0.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                         ,0x2f);
            local_5c0.filename = local_5c0.filename + 1;
            local_5c0.line = 0x6b1;
            local_5c0.funcname = "ParsePsbtData";
            logger::warn<int&>(&local_5c0,"wally_map_add NG[{}]",&local_3c);
            local_5e2 = 1;
            pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_5e0,"psbt add unknowns error.",&local_5e1);
            CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,&local_5e0);
            local_5e2 = 0;
            __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
          }
          local_3c = 0;
        }
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b0);
    }
    bVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(local_180);
  } while (((bVar4 ^ 0xffU) & 1) != 0);
  if (*(long *)(bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 8) == 0) {
    local_600.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_600.filename = local_600.filename + 1;
    local_600.line = 0x6ba;
    local_600.funcname = "ParsePsbtData";
    logger::warn<>(&local_600,"psbt global tx not found.");
    local_622 = 1;
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_620,"psbt global tx not found error.",&local_621);
    CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,&local_620);
    local_622 = 0;
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_3c = wally_map_sort((wally_map *)
                            (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x40),0);
  if (local_3c != 0) {
    local_640.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_640.filename = local_640.filename + 1;
    local_640.line = 0x6c1;
    local_640.funcname = "ParsePsbtData";
    logger::warn<int&>(&local_640,"wally_map_sort NG[{}]",&local_3c);
    local_662 = 1;
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_660,"psbt sort unknowns error.",&local_661);
    CfdException::CfdException(pCVar9,kCfdInternalError,&local_660);
    local_662 = 0;
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (*(long *)(*(long *)(bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 8) + 0x10) != 0) {
    local_680.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_680.filename = local_680.filename + 1;
    local_680.line = 0x6c6;
    local_680.funcname = "ParsePsbtData";
    logger::warn<>(&local_680,"psbt exist input. please use libwally-core.");
    i._6_1_ = 1;
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_6a0,"psbt exist input.",(allocator *)((long)&i + 7));
    CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,&local_6a0);
    i._6_1_ = 0;
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_3c = 0;
  for (uStack_6b0 = 0;
      uStack_6b0 <
      *(ulong *)(*(long *)(bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 8) + 0x28);
      uStack_6b0 = uStack_6b0 + 1) {
    ParsePsbtOutput((Deserializer *)local_e0,
                    (wally_psbt_output *)
                    (*(long *)(bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 0x28) +
                    uStack_6b0 * 0xd0));
  }
  local_6b4 = Deserializer::GetReadSize((Deserializer *)local_e0);
  sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_38);
  if (sVar8 != local_6b4) {
    local_6d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_6d0.filename = local_6d0.filename + 1;
    local_6d0.line = 0x6d0;
    local_6d0.funcname = "ParsePsbtData";
    logger::warn<>(&local_6d0,"psbt analyze error.");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_6f0,"psbt analyze error.",&local_6f1);
    CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,&local_6f0);
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  data_local = (ByteData *)
               bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_180);
  Deserializer::~Deserializer((Deserializer *)local_e0);
LAB_0058e2f2:
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_38);
  return (wally_psbt *)data_local;
}

Assistant:

struct wally_psbt *ParsePsbtData(const ByteData &data) {
  static const uint8_t kPsbtMagic[] = {'p', 's', 'b', 't', 0xff};

  struct wally_psbt *psbt = nullptr;
  std::vector<uint8_t> bytes = data.GetBytes();
  int ret = wally_psbt_from_bytes(bytes.data(), bytes.size(), &psbt);
  if (ret == WALLY_OK) {
    if ((psbt->num_inputs != 0) || (psbt->num_outputs != 0)) {
      return psbt;
    }
    std::vector<uint8_t> tmp_buf(bytes.size());
    size_t tmp_size = 0;
    ret = wally_psbt_to_bytes(
        psbt, 0, tmp_buf.data(), tmp_buf.size(), &tmp_size);
    if ((ret == WALLY_OK) && (tmp_size == bytes.size())) {
      // It was able to convert the data correctly.
      return psbt;
    }
    wally_psbt_free(psbt);
    psbt = nullptr;
  } else if (ret != WALLY_EINVAL) {
    warn(CFD_LOG_SOURCE, "wally_psbt_from_bytes NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt from bytes error.");
  }

  Deserializer parser(data);
  uint8_t magic[sizeof(kPsbtMagic)];
  memset(magic, 0, sizeof(magic));
  if (bytes.size() > 5) parser.ReadArray(magic, sizeof(magic));
  if (memcmp(magic, kPsbtMagic, sizeof(magic)) != 0) {
    warn(CFD_LOG_SOURCE, "psbt unmatch magic.");
    throw CfdException(kCfdInternalError, "psbt unmatch magic error.");
  }
  ret = wally_psbt_init_alloc(0, 0, 0, 0, &psbt);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_init_alloc NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt alloc error.");
  }

  try {
    memcpy(psbt->magic, magic, sizeof(psbt->magic));

    std::vector<uint8_t> key;
    do {
      key = parser.ReadVariableBuffer();
      if (!key.empty()) {
        std::vector<uint8_t> buf = parser.ReadVariableBuffer();
        bool has_key_1byte = (key.size() == 1);
        if (key[0] == Psbt::kPsbtGlobalUnsignedTx) {
          if (!has_key_1byte) {
            warn(CFD_LOG_SOURCE, "psbt invalid key format.");
            throw CfdException(
                kCfdIllegalArgumentError, "psbt invalid key format error.");
          }
          if (psbt->tx != nullptr) {
            warn(CFD_LOG_SOURCE, "global tx duplicates.");
            throw CfdException(
                kCfdIllegalArgumentError, "psbt global tx duplicates error.");
          }

          Transaction transaction(buf);
          if (transaction.GetTxInCount() != 0) {
            // failed to psbt format check on libwally-core.
            warn(CFD_LOG_SOURCE, "psbt format error.");
            throw CfdException(kCfdIllegalArgumentError, "psbt format error.");
          }
          auto txouts = transaction.GetTxOutList();
          struct wally_tx tx;
          memset(&tx, 0, sizeof(tx));
          tx.version = transaction.GetVersion();
          tx.locktime = transaction.GetLockTime();
          ret = wally_psbt_set_global_tx(psbt, &tx);
          if (ret != WALLY_OK) {
            warn(CFD_LOG_SOURCE, "wally_psbt_set_global_tx NG[{}]", ret);
            throw CfdException(kCfdInternalError, "psbt set tx error.");
          }
          for (uint32_t index = 0; index < txouts.size(); ++index) {
            const auto &txout = txouts[index];
            auto script_val = txout.GetLockingScript().GetData().GetBytes();
            struct wally_tx_output output;
            memset(&output, 0, sizeof(output));
            output.satoshi =
                static_cast<uint64_t>(txout.GetValue().GetSatoshiValue());
            output.script = script_val.data();
            output.script_len = script_val.size();
            ret = wally_psbt_add_output_at(psbt, index, 0, &output);
            if (ret != WALLY_OK) {
              warn(CFD_LOG_SOURCE, "wally_psbt_add_output_at NG[{}]", ret);
              throw CfdException(kCfdInternalError, "psbt set txout error.");
            }
          }
        } else if (key[0] == Psbt::kPsbtGlobalVersion) {
          if (!has_key_1byte) {
            warn(CFD_LOG_SOURCE, "psbt invalid key format.");
            throw CfdException(
                kCfdIllegalArgumentError, "psbt invalid key format error.");
          }
          if (psbt->version > 0) {
            warn(CFD_LOG_SOURCE, "psbt version duplicates.");
            throw CfdException(
                kCfdIllegalArgumentError, "psbt version duplicates error.");
          }
          if (buf.size() != sizeof(psbt->version)) {
            warn(CFD_LOG_SOURCE, "psbt invlid version size.");
            throw CfdException(
                kCfdIllegalArgumentError, "psbt invlid version size error.");
          }
          memcpy(&psbt->version, buf.data(), sizeof(psbt->version));
          if (psbt->version > Psbt::GetDefaultVersion()) {
            warn(
                CFD_LOG_SOURCE, "psbt unsupported version[{}]", psbt->version);
            throw CfdException(
                kCfdIllegalArgumentError, "psbt unsupported version error.");
          }
        } else {
          ret = wally_map_add(
              &psbt->unknowns, key.data(), key.size(), buf.data(), buf.size());
          if (ret != WALLY_OK) {
            warn(CFD_LOG_SOURCE, "wally_map_add NG[{}]", ret);
            throw CfdException(
                kCfdIllegalArgumentError, "psbt add unknowns error.");
          }
        }
      }
    } while (!key.empty());

    if (psbt->tx == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt global tx not found.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt global tx not found error.");
    }

    ret = wally_map_sort(&psbt->unknowns, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt sort unknowns error.");
    }

    if (psbt->tx->num_inputs != 0) {
      warn(CFD_LOG_SOURCE, "psbt exist input. please use libwally-core.");
      throw CfdException(kCfdIllegalArgumentError, "psbt exist input.");
    }

    for (size_t i = 0; i < psbt->tx->num_outputs; ++i) {
      ParsePsbtOutput(&parser, &psbt->outputs[i]);
    }

    uint32_t offset = parser.GetReadSize();
    if (bytes.size() != offset) {
      warn(CFD_LOG_SOURCE, "psbt analyze error.");
      throw CfdException(kCfdIllegalArgumentError, "psbt analyze error.");
    }
    return psbt;
  } catch (const CfdError &except) {
    wally_psbt_free(psbt);
    throw except;
  } catch (const std::exception &except) {
    wally_psbt_free(psbt);
    warn(CFD_LOG_SOURCE, "unknown exception.");
    throw CfdException(kCfdUnknownError, std::string(except.what()));
  } catch (...) {
    wally_psbt_free(psbt);
    warn(CFD_LOG_SOURCE, "unknown error.");
    throw CfdException();
  }
}